

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O0

void InitGamefield(Gamefield *gamefield)

{
  void *pvVar1;
  undefined8 *puVar2;
  GLuint *in_RDI;
  Pixel pixel;
  size_t i;
  Pixel local_24;
  ulong local_10;
  GLuint *local_8;
  
  in_RDI[1] = 0x4b0;
  in_RDI[2] = 0x438;
  local_8 = in_RDI;
  pvVar1 = malloc((ulong)in_RDI[1] * 0x14 * (ulong)in_RDI[2]);
  *(void **)(local_8 + 4) = pvVar1;
  *(undefined1 *)(local_8 + 6) = 0;
  (*glad_glGenTextures)(1,local_8);
  (*glad_glBindTexture)(0xde1,*local_8);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2802,0x812d);
  (*glad_glTexParameteri)(0xde1,0x2803,0x812d);
  for (local_10 = 0; local_10 < local_8[2] * local_8[1]; local_10 = local_10 + 1) {
    GetEmpty(&local_24);
    puVar2 = (undefined8 *)(*(long *)(local_8 + 4) + local_10 * 0x14);
    *puVar2 = local_24._0_8_;
    puVar2[1] = local_24._8_8_;
    *(undefined4 *)(puVar2 + 2) = local_24._16_4_;
  }
  OnUpdateGamefield((Gamefield *)pixel._12_8_);
  UnBindGamefield((Gamefield *)0x15afef);
  return;
}

Assistant:

void InitGamefield(Gamefield* gamefield) {
    gamefield->width = WIDTH;
    gamefield->height = HEIGHT;
    gamefield->pixels = malloc(sizeof(Pixel) * gamefield->width * gamefield->height);
    gamefield->simulationStep = 0;

    glGenTextures(1, &gamefield->rendererId);
    glBindTexture(GL_TEXTURE_2D, gamefield->rendererId);

    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_BORDER);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_BORDER);

    for (size_t i = 0; i < gamefield->height * gamefield->width; i++) {
        Pixel pixel;
        GetEmpty(&pixel);
        gamefield->pixels[i] = pixel;
    }

    OnUpdateGamefield(gamefield);
    UnBindGamefield(gamefield);
}